

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_read_scanline_chunk_info(exr_const_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  long lVar1;
  undefined8 uVar2;
  exr_attribute_t *peVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  exr_result_t eVar7;
  int iVar8;
  exr_attribute_t *peVar9;
  exr_const_priv_part_t in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  uint64_t unpacksize;
  exr_const_priv_part_t part;
  uint64_t *ctable;
  exr_attr_box2i_t dw;
  uint64_t dataoff;
  uint64_t chunkmin;
  int64_t fsize;
  int64_t ddata [3];
  int32_t data [3];
  int lpc;
  int rdcnt;
  int cidx;
  int miny;
  exr_result_t rv;
  exr_const_priv_part_t in_stack_ffffffffffffff78;
  exr_storage_t local_80;
  undefined8 uVar10;
  exr_attribute_t *peVar11;
  exr_attribute_t *local_68;
  exr_attribute_t *local_58;
  exr_attribute_t *local_50;
  exr_attribute_t *local_48;
  int local_40 [4];
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RCX == (exr_const_priv_part_t)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*(int *)(lVar1 + 4) == 0) || (*(int *)(lVar1 + 4) == 2)) {
        uVar2 = *(undefined8 *)(lVar1 + 0x90);
        uVar10 = *(undefined8 *)(lVar1 + 0x98);
        iVar8 = (int)((ulong)uVar2 >> 0x20);
        iVar6 = (int)((ulong)uVar10 >> 0x20);
        if ((in_EDX < iVar8) || (iVar6 < in_EDX)) {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,
                               "Invalid request for scanline %d outside range of data window (%d - %d)"
                               ,in_EDX,iVar8,iVar6);
        }
        else {
          local_40[3] = (int)*(short *)(lVar1 + 0xf0);
          iVar4 = in_EDX - iVar8;
          if (1 < local_40[3]) {
            iVar4 = iVar4 / local_40[3];
          }
          iVar5 = iVar8 + iVar4 * local_40[3];
          if ((iVar4 < 0) || (*(int *)(lVar1 + 0xf4) <= iVar4)) {
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "Invalid request for scanline %d in chunk %d outside chunk count %d"
                                 ,in_EDX,iVar4,*(undefined4 *)(lVar1 + 0xf4));
          }
          else {
            in_RCX->part_index = iVar4;
            *(char *)((long)&(in_RCX->attributes).entries + 6) = (char)*(undefined4 *)(lVar1 + 4);
            *(char *)((long)&(in_RCX->attributes).entries + 7) = (char)*(undefined4 *)(lVar1 + 0xb0)
            ;
            local_80 = (exr_storage_t)uVar2;
            in_RCX->storage_mode = local_80;
            (in_RCX->attributes).num_attributes = iVar5;
            *(exr_storage_t *)&(in_RCX->attributes).entries = ((int)uVar10 - local_80) + 1;
            (in_RCX->attributes).num_alloced = local_40[3];
            if (iVar5 < iVar8) {
              (in_RCX->attributes).num_attributes = iVar8;
              (in_RCX->attributes).num_alloced = (in_RCX->attributes).num_alloced - (iVar8 - iVar5);
            }
            else if ((long)iVar6 < (long)iVar5 + (long)local_40[3]) {
              (in_RCX->attributes).num_alloced = (iVar6 - iVar5) + 1;
            }
            *(undefined1 *)((long)&(in_RCX->attributes).entries + 4) = 0;
            *(undefined1 *)((long)&(in_RCX->attributes).entries + 5) = 0;
            local_4 = extract_chunk_table((exr_const_context_t)CONCAT44(in_ESI,in_EDX),in_RCX,
                                          (uint64_t **)CONCAT44(in_stack_ffffffffffffffdc,iVar5),
                                          (uint64_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
            if (local_4 == 0) {
              peVar3 = *(exr_attribute_t **)(in_RDI + 0x98);
              peVar11 = *(exr_attribute_t **)
                         (&in_stack_ffffffffffffff78->part_index + (long)iVar4 * 2);
              if (peVar11 == (exr_attribute_t *)0x0) {
                local_4 = 0x18;
              }
              else if ((peVar11 < local_68) || ((0 < (long)peVar3 && (peVar3 < peVar11)))) {
                local_4 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,0x16,
                                     "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %lu"
                                     ,in_EDX,iVar4,peVar11);
              }
              else {
                iVar6 = 1;
                if (in_RDI[5] != '\0') {
                  iVar6 = 2;
                }
                if (*(int *)(lVar1 + 4) != 2) {
                  iVar6 = iVar6 + 1;
                }
                local_4 = (**(code **)(in_RDI + 0x28))
                                    (in_RDI,local_40,(long)iVar6 << 2,&stack0xffffffffffffff90,0,0);
                if (local_4 == 0) {
                  priv_to_native32(local_40,iVar6);
                  iVar6 = 0;
                  if (in_RDI[5] != '\0') {
                    if (local_40[0] != in_ESI) {
                      eVar7 = (**(code **)(in_RDI + 0x48))
                                        (in_RDI,0x16,
                                         "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d"
                                         ,in_EDX,iVar4,local_40[0],in_ESI);
                      return eVar7;
                    }
                    iVar6 = 1;
                  }
                  if (iVar5 == local_40[iVar6]) {
                    if (*(int *)(lVar1 + 4) == 2) {
                      iVar8 = (**(code **)(in_RDI + 0x28))
                                        (in_RDI,&local_58,0x18,&stack0xffffffffffffff90,0,0);
                      if (iVar8 != 0) {
                        return iVar8;
                      }
                      priv_to_native64(&local_58,3);
                      if ((long)local_58 < 0) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %ld"
                                           ,in_EDX,iVar4,local_58);
                        return eVar7;
                      }
                      if (((long)local_50 < 0) || (0x7fffffff < (long)local_50)) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %ld"
                                           ,in_EDX,iVar4,local_50);
                        return eVar7;
                      }
                      if (((long)local_48 < 0) || (0x7fffffff < (long)local_48)) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %ld"
                                           ,in_EDX,iVar4,local_48);
                        return eVar7;
                      }
                      in_RCX->dataWindow = peVar11;
                      in_RCX->displayWindow = local_58;
                      (in_RCX->attributes).sorted_entries =
                           (exr_attribute_t **)(local_58->pad + (long)(peVar11->pad + -0x24));
                      in_RCX->channels = local_50;
                      in_RCX->compression = local_48;
                      if ((0 < (long)peVar3) &&
                         ((peVar3 < (exr_attribute_t *)
                                    (in_RCX->displayWindow->pad +
                                    (long)(in_RCX->dataWindow->pad + -0x24)) ||
                          (peVar3 < (exr_attribute_t *)
                                    ((long)(in_RCX->attributes).sorted_entries +
                                    (long)in_RCX->channels))))) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %ld + data size %ld larger than file %ld"
                                           ,in_EDX,iVar4,local_58,local_50,peVar3);
                        return eVar7;
                      }
                    }
                    else {
                      peVar9 = (exr_attribute_t *)
                               compute_chunk_unpack_size
                                         ((int)((ulong)peVar11 >> 0x20),(int)peVar11,
                                          (int)((ulong)uVar10 >> 0x20),(int)uVar10,iVar8,
                                          in_stack_ffffffffffffff78);
                      iVar6 = iVar6 + 1;
                      if ((local_40[iVar6] < 0) ||
                         (*(ulong *)(lVar1 + 0xe8) < (ulong)(long)local_40[iVar6])) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %lu, must be between 0 and %lu"
                                           ,in_EDX,iVar4,(long)local_40[iVar6],
                                           *(undefined8 *)(lVar1 + 0xe8));
                        return eVar7;
                      }
                      (in_RCX->attributes).sorted_entries = (exr_attribute_t **)peVar11;
                      in_RCX->channels = (exr_attribute_t *)(long)local_40[iVar6];
                      in_RCX->compression = peVar9;
                      in_RCX->dataWindow = (exr_attribute_t *)0x0;
                      in_RCX->displayWindow = (exr_attribute_t *)0x0;
                      if ((0 < (long)peVar3) &&
                         (peVar3 < (exr_attribute_t *)
                                   ((long)(in_RCX->attributes).sorted_entries +
                                   (long)in_RCX->channels))) {
                        eVar7 = (**(code **)(in_RDI + 0x48))
                                          (in_RDI,0x16,
                                           "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %lu, file offset %lu, size %ld"
                                           ,in_EDX,iVar4,in_RCX->channels,
                                           (in_RCX->attributes).sorted_entries,peVar3);
                        return eVar7;
                      }
                    }
                    if ((in_RCX->channels == (exr_attribute_t *)0x0) &&
                       (in_RCX->compression != (exr_attribute_t *)0x0)) {
                      local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid packed size of 0");
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                  else {
                    local_4 = (**(code **)(in_RDI + 0x48))
                                        (in_RDI,0x16,
                                         "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d"
                                         ,in_EDX,iVar4,local_40[iVar6],iVar5);
                  }
                }
              }
            }
          }
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x12);
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_read_scanline_chunk_info (
    exr_const_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_result_t     rv;
    int              miny, cidx, rdcnt, lpc;
    int32_t          data[3];
    int64_t          ddata[3];
    int64_t          fsize;
    uint64_t         chunkmin, dataoff;
    exr_attr_box2i_t dw;
    uint64_t*        ctable;

    EXR_READONLY_AND_DEFINE_PART (part_index);

    if (!cinfo) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode != EXR_STORAGE_SCANLINE &&
        part->storage_mode != EXR_STORAGE_DEEP_SCANLINE)
    {
        return ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = y - dw.min.y;
    if (lpc > 1) cidx /= lpc;

    // do we need to invert this when reading decreasing y? it appears not
    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = dw.min.y + cidx * lpc;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= dw.min.y - miny;
    }
    else if (((int64_t)miny + (int64_t)lpc) > (int64_t)dw.max.y)
    {
        cinfo->height = dw.max.y - miny + 1;
    }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (ctxt, part, &ctable, &chunkmin);
    if (rv != EXR_ERR_SUCCESS) return rv;

    fsize = ctxt->file_size;

    dataoff = ctable[cidx];

    /* known behavior for partial files */
    if (dataoff == 0)
        return EXR_ERR_INCOMPLETE_CHUNK_TABLE;

    if (dataoff < chunkmin || (fsize > 0 && dataoff > (uint64_t) fsize))
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %" PRIu64,
            y,
            cidx,
            dataoff);
    }

    /* TODO: Look at collapsing this into extract_chunk_leader, only
     * issue is more concrete error messages */
    /* multi part files have the part for validation */
    rdcnt = (ctxt->is_multipart) ? 2 : 1;
    /* deep has 64-bit data, so be variable about what we read */
    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++rdcnt;

    rv = ctxt->do_read (
        ctxt,
        data,
        (size_t) (rdcnt) * sizeof (int32_t),
        &dataoff,
        NULL,
        EXR_MUST_READ_ALL);

    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, rdcnt);

    rdcnt = 0;
    if (ctxt->is_multipart)
    {
        if (data[rdcnt] != part_index)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d",
                y,
                cidx,
                data[rdcnt],
                part_index);
        }
        ++rdcnt;
    }
    if (miny != data[rdcnt])
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d",
            y,
            cidx,
            data[rdcnt],
            miny);
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        rv = ctxt->do_read (
            ctxt,
            ddata,
            3 * sizeof (int64_t),
            &dataoff,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
        priv_to_native64 (ddata, 3);

        if (ddata[0] < 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %" PRId64,
                y,
                cidx,
                ddata[0]);
        }
        if (ddata[1] < 0 || ddata[1] > (int64_t) INT_MAX)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %" PRId64,
                y,
                cidx,
                ddata[1]);
        }
        if (ddata[2] < 0 || ddata[2] > (int64_t) INT_MAX)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %" PRId64,
                y,
                cidx,
                ddata[2]);
        }

        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size  = (uint64_t) ddata[0];
        cinfo->data_offset              = dataoff + (uint64_t) ddata[0];
        cinfo->packed_size              = (uint64_t) ddata[1];
        cinfo->unpacked_size            = (uint64_t) ddata[2];

        if (fsize > 0 &&
            ((cinfo->sample_count_data_offset +
              cinfo->sample_count_table_size) > ((uint64_t) fsize) ||
             (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize)))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %" PRId64
                " + data size %" PRId64 " larger than file %" PRId64,
                y,
                cidx,
                ddata[0],
                ddata[1],
                fsize);
        }
    }
    else
    {
        uint64_t unpacksize = compute_chunk_unpack_size (
            dw.min.x, miny, cinfo->width, cinfo->height, lpc, part);

        ++rdcnt;
        if (data[rdcnt] < 0 ||
            (uint64_t) data[rdcnt] > part->unpacked_size_per_chunk)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %" PRIu64
                ", must be between 0 and %" PRIu64,
                y,
                cidx,
                (uint64_t) data[rdcnt],
                part->unpacked_size_per_chunk);
        }

        cinfo->data_offset              = dataoff;
        cinfo->packed_size              = (uint64_t) data[rdcnt];
        cinfo->unpacked_size            = unpacksize;
        cinfo->sample_count_data_offset = 0;
        cinfo->sample_count_table_size  = 0;

        if (fsize > 0 &&
            (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %" PRIu64
                ", file offset %" PRIu64 ", size %" PRId64,
                y,
                cidx,
                cinfo->packed_size,
                cinfo->data_offset,
                fsize);
        }
    }

    if (cinfo->packed_size == 0 && cinfo->unpacked_size > 0)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid packed size of 0");
    return EXR_ERR_SUCCESS;
}